

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall OpenMD::MatrixAccumulator::clear(MatrixAccumulator *this)

{
  RectMatrix<double,_3U,_3U> *in_RDI;
  double in_stack_ffffffffffffffe8;
  
  in_RDI->data_[0][1] = 0.0;
  RectMatrix<double,_3U,_3U>::operator*=(in_RDI,in_stack_ffffffffffffffe8);
  RectMatrix<double,_3U,_3U>::operator*=(in_RDI,in_stack_ffffffffffffffe8);
  RectMatrix<double,_3U,_3U>::operator*=(in_RDI,in_stack_ffffffffffffffe8);
  RectMatrix<double,_3U,_3U>::operator*=(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void clear() {
      Count_ = 0;
      Avg_ *= 0.0;
      Avg2_ *= 0.0;
      Val_ *= 0.0;
      Total_ *= 0.0;
    }